

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddUnate.c
# Opt level: O0

DdNode * Extra_zddGetSingletonsBoth(DdManager *dd,DdNode *bVars)

{
  DdNode *pDVar1;
  DdNode *res;
  DdNode *bVars_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = extraZddGetSingletonsBoth(dd,bVars);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode * Extra_zddGetSingletonsBoth( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVars)    /* the set of variables */
{
    DdNode * res;
    do {
        dd->reordered = 0;
        res = extraZddGetSingletonsBoth( dd, bVars );
    } while (dd->reordered == 1);
    return(res);

}